

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

void duckdb::TimeBucketOriginFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  char cVar2;
  reference a;
  reference b;
  reference c;
  long lVar3;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  b = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  c = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if ((*a != (value_type)0x2) || (*c != (value_type)0x2)) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
              );
    return;
  }
  if (((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) ||
     ((*(byte **)(c + 0x28) != (byte *)0x0 && ((**(byte **)(c + 0x28) & 1) == 0)))) {
LAB_005b32b8:
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>((timestamp_t)**(int64_t **)(c + 0x20));
  if (!bVar1) goto LAB_005b32b8;
  local_38._0_8_ = **(undefined8 **)(a + 0x20);
  local_38.micros = (*(undefined8 **)(a + 0x20))[1];
  if (local_38.months == 0) {
    lVar3 = duckdb::Interval::GetMicro(&local_38);
    if (0 < lVar3) {
      cVar2 = '\0';
      goto LAB_005b32ee;
    }
  }
  cVar2 = '\x02' - ((local_38.micros == 0 && local_38.days == 0) && 0 < local_38.months);
LAB_005b32ee:
  if (cVar2 == '\x02') {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
              );
  }
  else {
    if (cVar2 == '\x01') {
      fun = TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
      ;
    }
    else {
      fun = TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
      ;
    }
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t)>
              (a,b,c,result,*(idx_t *)(args + 0x18),fun);
  }
  return;
}

Assistant:

static void TimeBucketOriginFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &origin_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR &&
	    origin_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg) || ConstantVector::IsNull(origin_arg) ||
		    !Value::IsFinite(*ConstantVector::GetData<T>(origin_arg))) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
		    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
		    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
	}
}